

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  size_t i;
  int iVar1;
  long lVar2;
  int a [4];
  int local_38 [6];
  
  lVar2 = 1;
  do {
    printf("%lu-th number: ",lVar2);
    __isoc99_scanf("%d");
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  lVar2 = 0;
  iVar1 = 0;
  do {
    if (iVar1 < local_38[lVar2]) {
      iVar1 = local_38[lVar2];
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  printf("The biggest number is %d.\n");
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  int a[N_INT];

  for (size_t i = 0; i < N_INT; i++) {
    printf("%lu-th number: ", i + 1);
    scanf("%d", &a[i]);
  }

  int max = 0;
  for (size_t i = 0; i < N_INT; i++) {
    if (a[i] > max) max = a[i];
  }

  printf("The biggest number is %d.\n", max);

  return 0;
}